

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QGate2<float>::apply
          (QGate2<float> *this,Op op,int nbQubits,vector<float,_std::allocator<float>_> *vector,
          int offset)

{
  vector<int,_std::allocator<int>_> qubits;
  anon_class_72_17_20e643c5 f;
  SquareMatrix<float> local_a0;
  _Vector_base<int,_std::allocator<int>_> local_90;
  anon_class_72_17_20e643c5 local_78;
  
  (*(this->super_QObject<float>)._vptr_QObject[5])(&local_90,this);
  *(ulong *)local_90._M_impl.super__Vector_impl_data._M_start =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)
                                       local_90._M_impl.super__Vector_impl_data._M_start >> 0x20),
                offset + (int)*(undefined8 *)local_90._M_impl.super__Vector_impl_data._M_start);
  (*(this->super_QObject<float>)._vptr_QObject[7])(&local_a0,this);
  lambda_QGate2<float>
            (&local_78,op,&local_a0,
             (vector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&local_a0.data_);
  apply4<qclab::qgates::lambda_QGate2<float>(qclab::Op,qclab::dense::SquareMatrix<float>,float*)::_lambda(unsigned_long,unsigned_long,unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_90._M_impl.super__Vector_impl_data._M_start,
             local_90._M_impl.super__Vector_impl_data._M_start[1],&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_90);
  return;
}

Assistant:

void QGate2< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_QGate2( op , this->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , f ) ;
  }